

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MercatorTile.cpp
# Opt level: O0

Tile mercatortile::parent(Tile *tile)

{
  int iVar1;
  Tile TVar2;
  Tile *tile_local;
  undefined4 uStack_10;
  Tile return_tile;
  
  if ((tile->x % 2 == 0) && (tile->y % 2 == 0)) {
    iVar1 = tile->z;
    unique0x100000d4 = CONCAT44(tile->y / 2,tile->x / 2);
  }
  else if (tile->x % 2 == 0) {
    iVar1 = tile->z;
    unique0x100000cc = CONCAT44((tile->y + -1) / 2,tile->x / 2);
  }
  else if ((tile->x % 2 == 0) || (tile->y % 2 != 0)) {
    iVar1 = tile->z;
    unique0x100000bc = CONCAT44((tile->y + -1) / 2,(tile->x + -1) / 2);
  }
  else {
    iVar1 = tile->z;
    unique0x100000c4 = CONCAT44(tile->y / 2,(tile->x + -1) / 2);
  }
  return_tile.x = iVar1 + -1;
  TVar2.z = return_tile.x;
  TVar2.x = tile_local._4_4_;
  TVar2.y = uStack_10;
  return TVar2;
}

Assistant:

Tile parent(const Tile &tile)
{
    Tile return_tile;
    if (tile.x % 2 == 0 && tile.y % 2 == 0)
    {
        return_tile = Tile{tile.x / 2, tile.y / 2, tile.z - 1};
    }
    else if (tile.x % 2 == 0)
    {
        return_tile = Tile{tile.x / 2, (tile.y - 1) / 2, tile.z - 1};
    }
    else if (!(tile.x % 2 == 0) && (tile.y % 2 == 0))
    {
        return_tile = Tile{(tile.x - 1) / 2, tile.y / 2, tile.z - 1};
    }
    else
    {
        return_tile = Tile{(tile.x - 1) / 2, (tile.y - 1) / 2, tile.z - 1};
    }

    return return_tile;
}